

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O0

void pospopcnt_u8_avx512vbmi_harley_seal(uint8_t *data,size_t len,uint32_t *flags)

{
  uint32_t *in_RDX;
  ulong in_RSI;
  long in_RDI;
  int i;
  uint32_t pospopcnt16 [16];
  uint32_t *in_stack_000009b0;
  uint32_t in_stack_000009bc;
  uint16_t *in_stack_000009c0;
  int local_5c;
  int local_58 [8];
  int aiStack_38 [8];
  uint32_t *local_18;
  ulong local_10;
  long local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(local_58,0,0x40);
  pospopcnt_u16_avx512vbmi_harley_seal(in_stack_000009c0,in_stack_000009bc,in_stack_000009b0);
  for (local_5c = 0; local_5c < 8; local_5c = local_5c + 1) {
    local_18[local_5c] = local_58[local_5c] + local_58[local_5c + 8];
  }
  if ((local_10 & 1) == 1) {
    pospopcnt_u8_scalar_naive_single(*(uint8_t *)(local_8 + (local_10 - 1)),local_18);
  }
  return;
}

Assistant:

pospopcnt_u16_stub(pospopcnt_u16_avx512vbmi_harley_seal)
pospopcnt_u8_stub(pospopcnt_u8_avx512vbmi_harley_seal)
#endif

int pospopcnt_u16_avx512_masked_ops(const uint16_t* data, uint32_t len, uint32_t* flags) {
    __m512i counter = _mm512_setzero_si512();
    __m512i ones = _mm512_set1_epi32(1);

    for (uint32_t i = 0; i < len; ++i) {
        counter = _mm512_mask_add_epi32(counter, data[i], counter, ones);
    }

    _mm512_storeu_si512((__m512i*)flags, counter);
    return 0;
}